

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_graph_shape.h
# Opt level: O0

Edge * __thiscall
s2builderutil::GraphShape::edge(Edge *__return_storage_ptr__,GraphShape *this,int e)

{
  Edge EVar1;
  Edge *pEVar2;
  S2Point *_v0;
  S2Point *_v1;
  VertexId local_1c;
  VertexId VStack_18;
  Edge g_edge;
  int e_local;
  GraphShape *this_local;
  
  pEVar2 = S2Builder::Graph::edge(this->g_,e);
  EVar1 = *pEVar2;
  local_1c = EVar1.first;
  _v0 = S2Builder::Graph::vertex(this->g_,local_1c);
  VStack_18 = EVar1.second;
  _v1 = S2Builder::Graph::vertex(this->g_,VStack_18);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

Edge edge(int e) const override {
    Graph::Edge g_edge = g_.edge(e);
    return Edge(g_.vertex(g_edge.first), g_.vertex(g_edge.second));
  }